

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O2

bool iDynTree::exportSolidShape
               (SolidShape *solidShape,exportSolidShapePropertyType type,xmlNodePtr parent_element)

{
  char cVar1;
  bool bVar2;
  xmlNodePtr parent_element_00;
  string *psVar3;
  Transform *trans;
  undefined8 uVar4;
  undefined8 *puVar5;
  VectorFixSize<3U> *in;
  ostream *poVar6;
  Material *pMVar7;
  undefined8 uVar8;
  ulong uVar9;
  string length_str;
  string shapeName;
  string element_name;
  string local_100;
  undefined1 local_e0 [104];
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  VectorFixSize<4U> local_48;
  
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  std::__cxx11::string::assign((char *)&local_68);
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,local_68,0);
  cVar1 = iDynTree::SolidShape::isNameValid();
  if (cVar1 != '\0') {
    psVar3 = (string *)iDynTree::SolidShape::getName_abi_cxx11_();
    std::__cxx11::string::string((string *)local_e0,psVar3);
    xmlNewProp(parent_element_00,"name",local_e0._0_8_);
    std::__cxx11::string::~string((string *)local_e0);
  }
  trans = (Transform *)iDynTree::SolidShape::getLink_H_geometry();
  bVar2 = exportTransform(trans,parent_element_00);
  uVar4 = xmlNewChild(parent_element_00,0,"geometry",0);
  cVar1 = iDynTree::SolidShape::isBox();
  if (cVar1 == '\0') {
    cVar1 = iDynTree::SolidShape::isCylinder();
    if (cVar1 == '\0') {
      cVar1 = iDynTree::SolidShape::isSphere();
      if (cVar1 == '\0') {
        cVar1 = iDynTree::SolidShape::isExternalMesh();
        if (cVar1 == '\0') {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "[ERROR] URDFModelExport: Impossible to convert geometry of type "
                                  );
          poVar6 = std::operator<<(poVar6,"PKN8iDynTree10SolidShapeE");
          poVar6 = std::operator<<(poVar6," to a URDF geometry.");
          std::endl<char,std::char_traits<char>>(poVar6);
          bVar2 = false;
          goto LAB_00135088;
        }
        iDynTree::SolidShape::asExternalMesh();
        uVar4 = xmlNewChild(uVar4,0,"mesh",0);
        puVar5 = (undefined8 *)iDynTree::ExternalMesh::getFilename_abi_cxx11_();
        xmlNewProp(uVar4,"filename",*puVar5);
        local_e0._0_8_ = local_e0 + 0x10;
        local_e0._8_8_ = 0.0;
        local_e0[0x10] = '\0';
        if (bVar2) {
          in = (VectorFixSize<3U> *)iDynTree::ExternalMesh::getScale();
          bVar2 = vectorToString<iDynTree::VectorFixSize<3u>>(in,(string *)local_e0);
        }
        else {
          bVar2 = false;
        }
        xmlNewProp(uVar4,"scale",local_e0._0_8_);
      }
      else {
        iDynTree::SolidShape::asSphere();
        uVar4 = xmlNewChild(uVar4,0,"sphere",0);
        local_e0._0_8_ = local_e0 + 0x10;
        local_e0._8_8_ = 0.0;
        local_e0[0x10] = '\0';
        if (bVar2) {
          local_100._M_dataplus._M_p = (pointer)iDynTree::Sphere::getRadius();
          bVar2 = doubleToStringWithClassicLocale((double *)&local_100,(string *)local_e0);
        }
        else {
          bVar2 = false;
        }
        xmlNewProp(uVar4,"radius",local_e0._0_8_);
      }
    }
    else {
      iDynTree::SolidShape::asCylinder();
      uVar4 = xmlNewChild(uVar4,0,"cylinder",0);
      local_e0._0_8_ = local_e0 + 0x10;
      local_e0._8_8_ = 0.0;
      local_e0[0x10] = '\0';
      if (bVar2) {
        local_100._M_dataplus._M_p = (pointer)iDynTree::Cylinder::getRadius();
        bVar2 = doubleToStringWithClassicLocale((double *)&local_100,(string *)local_e0);
      }
      else {
        bVar2 = false;
      }
      xmlNewProp(uVar4,"radius",local_e0._0_8_);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_allocated_capacity =
           local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (bVar2 == false) {
        bVar2 = false;
      }
      else {
        local_48.m_data[0] = (double)iDynTree::Cylinder::getLength();
        bVar2 = doubleToStringWithClassicLocale(local_48.m_data,&local_100);
      }
      xmlNewProp(uVar4,"length",local_100._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_100);
    }
  }
  else {
    iDynTree::SolidShape::asBox();
    uVar4 = xmlNewChild(uVar4,0,"box",0);
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)iDynTree::Box::getX();
    local_78 = iDynTree::Box::getY();
    uVar9 = iDynTree::Box::getZ();
    local_e0._0_8_ = local_e0 + 0x10;
    local_e0._8_8_ = 0.0;
    local_e0[0x10] = '\0';
    if (bVar2) {
      local_100._M_dataplus._M_p = (pointer)local_70;
      local_100._M_string_length = local_78;
      local_100.field_2._M_allocated_capacity = uVar9;
      bVar2 = vectorToString<iDynTree::VectorFixSize<3u>>
                        ((VectorFixSize<3U> *)&local_100,(string *)local_e0);
    }
    else {
      bVar2 = false;
    }
    xmlNewProp(uVar4,"size",local_e0._0_8_);
  }
  std::__cxx11::string::~string((string *)local_e0);
  cVar1 = iDynTree::SolidShape::isMaterialSet();
  if (cVar1 != '\0') {
    pMVar7 = (Material *)iDynTree::SolidShape::getMaterial();
    Material::Material((Material *)local_e0,pMVar7);
    uVar4 = xmlNewChild(parent_element_00,0,"material",0);
    iDynTree::Material::name_abi_cxx11_();
    xmlNewProp(uVar4,"name",local_100._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_100);
    cVar1 = iDynTree::Material::hasColor();
    if (cVar1 != '\0') {
      uVar8 = xmlNewChild(uVar4,0,"color",0);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_allocated_capacity =
           local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (bVar2 == false) {
        bVar2 = false;
      }
      else {
        iDynTree::Material::color();
        bVar2 = vectorToString<iDynTree::VectorFixSize<4u>>(&local_48,&local_100);
      }
      xmlNewProp(uVar8,"rgba",local_100._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_100);
    }
    cVar1 = iDynTree::Material::hasTexture();
    if (cVar1 != '\0') {
      uVar4 = xmlNewChild(uVar4,0,"texture",0);
      iDynTree::Material::texture_abi_cxx11_();
      xmlNewProp(uVar4,"filename",local_100._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_100);
    }
    Material::~Material((Material *)local_e0);
  }
LAB_00135088:
  std::__cxx11::string::~string((string *)&local_68);
  return bVar2;
}

Assistant:

bool exportSolidShape(const SolidShape* solidShape, exportSolidShapePropertyType type, xmlNodePtr parent_element)
{
    bool ok=true;
    std::string element_name;
    if (type == VISUAL) {
        element_name = "visual";
    } else {
        // assert(type == COLLISION)
        element_name = "collision";
    }

    xmlNodePtr root_shape_xml = xmlNewChild(parent_element, NULL, BAD_CAST element_name.c_str(), NULL);
    // Omit the name (that is an optional attribute) if the shape has no name
    if (solidShape->isNameValid()) {
        std::string shapeName = solidShape->getName();
        xmlNewProp(root_shape_xml, BAD_CAST "name", BAD_CAST shapeName.c_str());
    }

    // Export transform
    ok = ok && exportTransform(solidShape->getLink_H_geometry(), root_shape_xml);

    // Export geometry
    xmlNodePtr geometry_xml = xmlNewChild(root_shape_xml, NULL, BAD_CAST "geometry", NULL);

    if (solidShape->isBox()) {
        const Box* box = solidShape->asBox();

        // Export box element
        xmlNodePtr box_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "box", NULL);

        // Export size attribute
        double size_data[3] = {box->getX(), box->getY(), box->getZ()};
        std::string size_str;
        ok = ok && vectorToString(Vector3(size_data, 3) , size_str);
        xmlNewProp(box_xml, BAD_CAST "size", BAD_CAST size_str.c_str());

    } else if (solidShape->isCylinder()) {
        const Cylinder* cylinder = solidShape->asCylinder();

        // Export cylinder element
        xmlNodePtr cylinder_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "cylinder", NULL);

        // Export radius attribute
        std::string radius_str;
        ok = ok && doubleToStringWithClassicLocale(cylinder->getRadius(), radius_str);
        xmlNewProp(cylinder_xml, BAD_CAST "radius", BAD_CAST radius_str.c_str());

        // Export length attribute
        std::string length_str;
        ok = ok && doubleToStringWithClassicLocale(cylinder->getLength(), length_str);
        xmlNewProp(cylinder_xml, BAD_CAST "length", BAD_CAST length_str.c_str());

    } else if (solidShape->isSphere()) {
        const Sphere* sphere = solidShape->asSphere();

        // Export sphere  element
        xmlNodePtr sphere_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "sphere", NULL);

        // Export radius attribute
        std::string radius_str;
        ok = ok && doubleToStringWithClassicLocale(sphere->getRadius(), radius_str);
        xmlNewProp(sphere_xml, BAD_CAST "radius", BAD_CAST radius_str.c_str());

    } else if (solidShape->isExternalMesh()) {
        const ExternalMesh* mesh = solidShape->asExternalMesh();

        // Export mesh element
        xmlNodePtr mesh_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "mesh", NULL);

        // Export filename attribute
        xmlNewProp(mesh_xml, BAD_CAST "filename", BAD_CAST mesh->getFilename().c_str());

        // Export scale attribute
        std::string scale_str;
        ok = ok && vectorToString(mesh->getScale(), scale_str);
        xmlNewProp(mesh_xml, BAD_CAST "scale", BAD_CAST scale_str.c_str());

    } else {
        std::cerr << "[ERROR] URDFModelExport: Impossible to convert geometry of type "
                  <<  typeid(solidShape).name() << " to a URDF geometry." << std::endl;
        return false;
    }

    // Export material if set.
    if (solidShape->isMaterialSet()) {
        auto material = solidShape->getMaterial();
        xmlNodePtr material_xml = xmlNewChild(root_shape_xml, NULL, BAD_CAST "material", NULL);
        xmlNewProp(material_xml, BAD_CAST "name", BAD_CAST material.name().c_str());

        if (material.hasColor()) {
            xmlNodePtr color_xml = xmlNewChild(material_xml, NULL, BAD_CAST "color", NULL);
            std::string material_str;
            ok = ok && vectorToString(material.color(), material_str);
            xmlNewProp(color_xml, BAD_CAST "rgba", BAD_CAST material_str.c_str());
        }
        if (material.hasTexture()) {
            xmlNodePtr texture_xml = xmlNewChild(material_xml, NULL, BAD_CAST "texture", NULL);
            xmlNewProp(texture_xml, BAD_CAST "filename", BAD_CAST material.texture().c_str());
        }
    }

    return ok;
}